

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_PROBE(effect_handler_context_t_conflict *context)

{
  loc grid;
  bool bVar1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  monster *mon;
  char *pcVar5;
  char m_name [80];
  char local_88 [88];
  
  wVar3 = cave_monster_max(cave);
  if (L'\x01' < wVar3) {
    wVar3 = L'\x01';
    bVar1 = false;
    do {
      mon = cave_monster(cave,wVar3);
      if (mon->race != (monster_race *)0x0) {
        grid.x = (mon->grid).x;
        grid.y = (mon->grid).y;
        _Var2 = square_isview(cave,grid);
        if (_Var2) {
          _Var2 = monster_is_visible(mon);
          if (_Var2) {
            if (!bVar1) {
              msg("Probing...");
            }
            monster_desc(local_88,0x50,mon,L'̄');
            pcVar5 = "s";
            if ((int)mon->hp == 1) {
              pcVar5 = "";
            }
            msg("%s has %d hit point%s.",local_88,(ulong)(uint)(int)mon->hp,pcVar5);
            lore_do_probe(mon);
            bVar1 = true;
          }
        }
      }
      wVar3 = wVar3 + L'\x01';
      wVar4 = cave_monster_max(cave);
    } while (wVar3 < wVar4);
    if (bVar1) {
      msg("That\'s all.");
      context->ident = true;
    }
  }
  return true;
}

Assistant:

bool effect_handler_PROBE(effect_handler_context_t *context)
{
	int i;

	bool probe = false;

	/* Probe all (nearby) monsters */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Paranoia -- Skip dead monsters */
		if (!mon->race) continue;

		/* Require line of sight */
		if (!square_isview(cave, mon->grid)) continue;

		/* Probe visible monsters */
		if (monster_is_visible(mon)) {
			char m_name[80];

			/* Start the message */
			if (!probe) msg("Probing...");

			/* Get "the monster" or "something" */
			monster_desc(m_name, sizeof(m_name), mon,
				MDESC_IND_HID | MDESC_CAPITAL | MDESC_COMMA);

			/* Describe the monster */
			msg("%s has %d hit point%s.", m_name, mon->hp, (mon->hp == 1) ? "" : "s");

			/* Learn all of the non-spell, non-treasure flags */
			lore_do_probe(mon);

			/* Probe worked */
			probe = true;
		}
	}

	/* Done */
	if (probe) {
		msg("That's all.");
		context->ident = true;
	}

	return true;
}